

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O3

void __thiscall Peeps::PeepFunc(Peeps *this)

{
  PeepsMD *this_00;
  char cVar1;
  ushort uVar2;
  OpCode OVar3;
  Func *pFVar4;
  code *pcVar5;
  bool bVar6;
  OpndKind OVar7;
  byte bVar8;
  bool bVar9;
  IRKind IVar10;
  uint uVar11;
  uint uVar12;
  JITTimeFunctionBody *pJVar13;
  FunctionJITTimeInfo *pFVar14;
  undefined4 *puVar15;
  Func *pFVar16;
  Func *branchInstr;
  Instr *pIVar17;
  RegOpnd *pRVar18;
  Instr *instr;
  IntConstOpnd *src2Opnd;
  Func *pFVar19;
  BranchInstr *branchInstr_00;
  char *pcVar20;
  Func *pFVar21;
  RegNum reg;
  Opnd *pOVar22;
  bool local_33;
  bool local_32;
  char local_31;
  bool peeped;
  bool peeped_1;
  
  pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
  pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
  local_31 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,PeepsPhase,uVar11,uVar12);
  AgenPeeps::PeepFunc(&this->peepsAgen);
  this_00 = &this->peepsMD;
  PeepsMD::Init(this_00,this);
  memset(this->regMap,0,0x108);
  SymTable::ClearStackSymScratch(this->func->m_symTable);
  pFVar21 = (Func *)this->func->m_headInstr;
  if (pFVar21 != (Func *)0x0) {
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    bVar9 = false;
    do {
      pFVar19 = (Func *)pFVar21->m_threadContextInfo;
      pFVar16 = pFVar19;
      switch(*(undefined1 *)((long)&pFVar21->constructorCaches + 1)) {
      case 2:
        if (((local_31 == '\0') && ((short)pFVar21->constructorCacheCount != 0xeb)) &&
           ((pFVar21->callSiteToArgumentsOffsetFixupMap == (CallSiteToArgumentsOffsetFixupMap *)0x0
            || ((ushort)((short)*(undefined4 *)&pFVar21->callSiteToArgumentsOffsetFixupMap->stats -
                        0x299U) < 0xfffe)))) {
          pFVar16 = (Func *)PeepBranch((BranchInstr *)pFVar21,(bool *)0x0);
          if ((pFVar16 == (Func *)0x0) ||
             (branchInstr_00 = (BranchInstr *)pFVar16->m_scriptContextInfo,
             branchInstr_00 == (BranchInstr *)0x0)) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                               ,0x7c,"(instrNext && instrNext->m_prev)",
                               "instrNext && instrNext->m_prev");
            if (!bVar6) goto LAB_0061bbe0;
            *puVar15 = 0;
            branchInstr_00 = (BranchInstr *)pFVar16->m_scriptContextInfo;
          }
          if ((branchInstr_00->super_Instr).m_kind == InstrKindBranch) {
            pFVar16 = (Func *)HoistSameInstructionAboveSplit(this,branchInstr_00,(Instr *)pFVar16);
          }
        }
        break;
      case 3:
      case 5:
        if (local_31 == '\0') {
          reg = RegRAX;
          do {
            ClearReg(this,reg);
            reg = reg + RegRAX;
          } while (reg != RegNumCount);
          cVar1 = *(undefined1 *)((long)&pFVar21->constructorCaches + 1);
          if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
            if (!bVar6) goto LAB_0061bbe0;
            *puVar15 = 0;
          }
          pcVar20 = (char *)pFVar21;
          if ((pFVar21->propertyGuardsByPropertyId ==
               (PropertyGuardByPropertyIdMap *)&pFVar21->propertyGuardsByPropertyId) &&
             (((ulong)pFVar21->propertiesWrittenTo & 4) == 0)) {
            cVar1 = *(undefined1 *)((long)&pFVar21->constructorCaches + 1);
            if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar6) goto LAB_0061bbe0;
              *puVar15 = 0;
            }
            pFVar16 = (Func *)PeepUnreachableLabel((LabelInstr *)pFVar21,bVar9,&local_33);
            pFVar19 = pFVar16;
            if (local_33 != false) break;
          }
          else {
            branchInstr = (Func *)IR::Instr::GetPrevRealInstr((Instr *)pFVar21);
            if (*(IRKind *)((long)&branchInstr->constructorCaches + 1) == InstrKindBranch) {
              OVar3 = *(OpCode *)&branchInstr->constructorCacheCount;
              if (OVar3 < ADD) {
                if ((OVar3 == MultiBr) || (OVar3 == Br)) goto LAB_0061b5ee;
              }
              else {
                pcVar20 = (char *)branchInstr;
                bVar6 = LowererMD::IsUnconditionalBranch((Instr *)branchInstr);
                if (bVar6) {
LAB_0061b5ee:
                  pFVar16 = (Func *)branchInstr->callSiteToArgumentsOffsetFixupMap;
                  bVar6 = *(bool *)((long)&branchInstr->propertyGuardsByPropertyId + 1);
                  if (pFVar16 == (Func *)0x0) {
                    if (bVar6 == false) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar15 = 1;
                      pcVar20 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                      ;
                      bVar9 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                         ,0x20e,"(m_isMultiBranch)","m_isMultiBranch");
                      if (!bVar9) goto LAB_0061bbe0;
                      *puVar15 = 0;
                    }
                  }
                  else {
                    if (bVar6 != false) {
                      AssertCount = AssertCount + 1;
                      Js::Throw::LogAssert();
                      *puVar15 = 1;
                      pcVar20 = 
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                      ;
                      bVar6 = Js::Throw::ReportAssert
                                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                         ,0x209,"(!m_isMultiBranch)","!m_isMultiBranch");
                      if (!bVar6) goto LAB_0061bbe0;
                      *puVar15 = 0;
                      pFVar16 = (Func *)branchInstr->callSiteToArgumentsOffsetFixupMap;
                    }
                    if (pFVar16 == pFVar21) {
                      pFVar4 = ((PeepsMD *)&branchInstr->m_threadContextInfo)->func;
                      pFVar16 = (Func *)PeepBranch((BranchInstr *)branchInstr,&local_32);
                      if ((local_32 != false) || (pcVar20 = (char *)branchInstr, pFVar16 != pFVar4))
                      break;
                    }
                  }
                }
              }
            }
          }
          cVar1 = *(undefined1 *)((long)&pFVar21->constructorCaches + 1);
          if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar15 = 1;
            pcVar20 = 
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
            ;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
            if (!bVar9) goto LAB_0061bbe0;
            *puVar15 = 0;
          }
          bVar8 = *(byte *)&pFVar21->propertiesWrittenTo;
          IVar10 = *(undefined1 *)((long)&pFVar19->constructorCaches + 1);
          if ((IVar10 == InstrKindProfiledLabel) || (IVar10 == InstrKindLabel)) {
            cVar1 = *(undefined1 *)((long)&pFVar21->constructorCaches + 1);
            if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar9) goto LAB_0061bbe0;
              *puVar15 = 0;
              IVar10 = *(undefined1 *)((long)&pFVar19->constructorCaches + 1);
            }
            if ((IVar10 != InstrKindLabel) && (IVar10 != InstrKindProfiledLabel)) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                 ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
              if (!bVar9) goto LAB_0061bbe0;
              *puVar15 = 0;
            }
            pFVar19 = (Func *)CleanupLabel((LabelInstr *)pFVar21,(LabelInstr *)pFVar19);
            IVar10 = *(IRKind *)((long)&pFVar19->constructorCaches + 1);
            pcVar20 = (char *)pFVar21;
          }
          pFVar21 = pFVar19;
          if ((IVar10 != InstrKindLabel) && (IVar10 != InstrKindProfiledLabel)) {
            cVar1 = *(undefined1 *)
                     ((long)&pFVar19->m_scriptContextInfo[7]._vptr_ScriptContextInfo + 1);
            if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar15 = 1;
              pcVar20 = 
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
              ;
              bVar9 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                                 ,0x61,
                                 "(instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr())",
                                 "instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr()");
              if (!bVar9) goto LAB_0061bbe0;
              *puVar15 = 0;
              IVar10 = *(undefined1 *)((long)&pFVar19->constructorCaches + 1);
            }
            if ((IVar10 != InstrKindLabel) && (IVar10 != InstrKindProfiledLabel)) {
              pFVar21 = (Func *)pFVar19->m_scriptContextInfo;
              cVar1 = *(undefined1 *)((long)&pFVar21->constructorCaches + 1);
              if ((cVar1 != '\x03') && (cVar1 != '\x05')) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar15 = 1;
                pcVar20 = 
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                ;
                bVar9 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                                   ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
                if (!bVar9) goto LAB_0061bbe0;
                *puVar15 = 0;
              }
            }
          }
          bVar8 = bVar8 & 2;
          if (bVar8 == 0) {
            bVar6 = false;
          }
          else {
            bVar6 = (bool)((*(byte *)&pFVar21->propertiesWrittenTo & 2) >> 1);
          }
          bVar9 = (bool)(bVar8 >> 1);
          pFVar16 = (Func *)PeepCondMove((Peeps *)pcVar20,(LabelInstr *)pFVar21,(Instr *)pFVar19,
                                         bVar6);
        }
        break;
      default:
        bVar6 = LowererMD::IsAssign((Instr *)pFVar21);
        if (bVar6) {
          if (local_31 == '\0') {
            pFVar16 = (Func *)PeepAssign(this,(Instr *)pFVar21);
          }
        }
        else {
          uVar2 = (ushort)pFVar21->constructorCacheCount;
          if (uVar2 < 0x412) {
            if (((uVar2 == 7) || (uVar2 == 0x18a)) || (uVar2 == 0x1ee)) goto LAB_0061b472;
LAB_0061b685:
            if (local_31 == '\0') {
              pIVar17 = PeepRedundant(this,(Instr *)pFVar21);
              pOVar22 = pIVar17->m_dst;
              if ((pOVar22 != (Opnd *)0x0) &&
                 (OVar7 = IR::Opnd::GetKind(pOVar22), OVar7 == OpndKindReg)) {
                OVar7 = IR::Opnd::GetKind(pOVar22);
                if (OVar7 != OpndKindReg) {
                  AssertCount = AssertCount + 1;
                  Js::Throw::LogAssert();
                  *puVar15 = 1;
                  bVar6 = Js::Throw::ReportAssert
                                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                     ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                  if (!bVar6) goto LAB_0061bbe0;
                  *puVar15 = 0;
                }
                ClearReg(this,*(RegNum *)((long)&pOVar22[1].m_valueType.field_0.bits + 1));
              }
              PeepsMD::ProcessImplicitRegs(this_00,pIVar17);
              OVar3 = pIVar17->m_opcode;
              if (OVar3 == TEST) {
                OVar7 = IR::Opnd::GetKind(pIVar17->m_src2);
                if (OVar7 == OpndKindIntConst) {
                  pOVar22 = pIVar17->m_src2;
                  OVar7 = IR::Opnd::GetKind(pOVar22);
                  if (OVar7 != OpndKindIntConst) {
                    AssertCount = AssertCount + 1;
                    Js::Throw::LogAssert();
                    *puVar15 = 1;
                    bVar6 = Js::Throw::ReportAssert
                                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                       ,0xc0,"(this->IsIntConstOpnd())",
                                       "Bad call to AsIntConstOpnd()");
                    if (!bVar6) goto LAB_0061bbe0;
                    *puVar15 = 0;
                  }
                  if ((((ulong)pOVar22[1]._vptr_Opnd & 0xffffff00) == 0) &&
                     (OVar7 = IR::Opnd::GetKind(pIVar17->m_src1), OVar7 == OpndKindReg)) {
                    pRVar18 = IR::Opnd::AsRegOpnd(pIVar17->m_src1);
                    bVar8 = LinearScan::GetRegAttribs(pRVar18->m_reg);
                    if ((((bVar8 & 8) != 0) &&
                        (*(IRKind *)((long)&pFVar19->constructorCaches + 1) == InstrKindBranch)) &&
                       ((*(OpCode *)&pFVar19->constructorCacheCount == JNE ||
                        (*(OpCode *)&pFVar19->constructorCacheCount == JEQ)))) {
                      pIVar17->m_src1->m_type = TyInt8;
                      pIVar17->m_src2->m_type = TyInt8;
                    }
                  }
                }
                OVar3 = pIVar17->m_opcode;
              }
              if (OVar3 == CVTSI2SD) {
                pOVar22 = pIVar17->m_dst;
                instr = IR::Instr::New(XORPS,pOVar22,pOVar22,pOVar22,pIVar17->m_func);
                IR::Instr::InsertBefore(pIVar17,instr);
              }
            }
          }
          else {
            if ((uVar2 == 0x412) || (uVar2 == 0x41b)) {
              if (local_31 != '\0') break;
              bVar6 = AutoSystemInfo::IsAtomPlatform(&AutoSystemInfo::Data);
              if (!bVar6) {
                pJVar13 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
                uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar13);
                pFVar14 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
                uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar14);
                bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_01599240,AtomPhase,uVar11,uVar12);
                if (bVar6) goto LAB_0061b590;
                goto LAB_0061bb53;
              }
LAB_0061b590:
              if (*(undefined1 *)((long)&pFVar21->constructorCaches + 1) == '\x06') {
LAB_0061b59b:
                pIVar17 = IR::Instr::GetNextRealInstr((Instr *)pFVar21);
                bVar6 = IsJccOrShiftInstr(pIVar17);
                if (bVar6) goto LAB_0061bad2;
                if (pIVar17->m_kind != InstrKindExit) {
                  pIVar17 = IR::Instr::GetNextRealInstr(pIVar17);
                  bVar6 = IsJccOrShiftInstr(pIVar17);
                  if (bVar6) goto LAB_0061bad2;
                }
              }
              else {
                pIVar17 = IR::Instr::GetPrevRealInstr((Instr *)pFVar21);
                bVar6 = IsJccOrShiftInstr(pIVar17);
                if (!bVar6) {
                  if (pIVar17->m_kind != InstrKindEntry) {
                    pIVar17 = IR::Instr::GetPrevRealInstr(pIVar17);
                    bVar6 = IsJccOrShiftInstr(pIVar17);
                    if (bVar6) goto LAB_0061bad2;
                  }
                  if (*(undefined1 *)((long)&pFVar21->constructorCaches + 1) == '\a')
                  goto LAB_0061bb53;
                  goto LAB_0061b59b;
                }
LAB_0061bad2:
                src2Opnd = IR::IntConstOpnd::New
                                     (1,*(IRType *)
                                         ((long)&(pFVar21->pinnedTypeRefs->
                                                 super_BaseDictionary<void_*,_void_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                                                 ).entries + 2),(Func *)pFVar21->m_workItem,false);
                pFVar19 = (Func *)IR::Instr::New(ADD,(Opnd *)pFVar21->pinnedTypeRefs,
                                                 (Opnd *)pFVar21->pinnedTypeRefs,
                                                 &src2Opnd->super_Opnd,(Func *)pFVar21->m_workItem);
                if ((short)pFVar21->constructorCacheCount == 0x412) {
                  *(OpCode *)&pFVar19->constructorCacheCount = SUB;
                }
                IR::Instr::InsertAfter((Instr *)pFVar21,(Instr *)pFVar19);
                IR::Instr::Remove((Instr *)pFVar21);
                pFVar21 = pFVar19;
              }
LAB_0061bb53:
              pOVar22 = (Opnd *)pFVar21->pinnedTypeRefs;
            }
            else {
              if (uVar2 != 0x442) goto LAB_0061b685;
              PeepsMD::PeepAssign(this_00,(Instr *)pFVar21);
              pOVar22 = (Opnd *)pFVar21->pinnedTypeRefs;
            }
            if ((pOVar22 != (Opnd *)0x0) &&
               (OVar7 = IR::Opnd::GetKind(pOVar22), OVar7 == OpndKindReg)) {
              OVar7 = IR::Opnd::GetKind(pOVar22);
              if (OVar7 != OpndKindReg) {
                AssertCount = AssertCount + 1;
                Js::Throw::LogAssert();
                *puVar15 = 1;
                bVar6 = Js::Throw::ReportAssert
                                  ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                   ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
                if (!bVar6) {
LAB_0061bbe0:
                  pcVar5 = (code *)invalidInstructionException();
                  (*pcVar5)();
                }
                *puVar15 = 0;
              }
              ClearReg(this,*(byte *)((long)&pOVar22[1].m_valueType.field_0.bits + 1));
            }
          }
        }
        break;
      case 8:
        if ((short)pFVar21->constructorCacheCount == 6) {
LAB_0061b472:
          IR::Instr::Remove((Instr *)pFVar21);
        }
      }
      pFVar21 = pFVar16;
    } while (pFVar16 != (Func *)0x0);
  }
  return;
}

Assistant:

void
Peeps::PeepFunc()
{
    bool peepsEnabled = true;
    if (PHASE_OFF(Js::PeepsPhase, this->func))
    {
        peepsEnabled = false;
    }

#if defined(_M_IX86) || defined(_M_X64)
    // Agen dependency elimination pass
    // Since it can reveal load elimination opportunities for the normal peeps pass, we do it separately.
    this->peepsAgen.PeepFunc();
#endif

    this->peepsMD.Init(this);

    // Init regMap
    memset(this->regMap, 0, sizeof(this->regMap));

    // Scratch field needs to be cleared.
    this->func->m_symTable->ClearStackSymScratch();

    bool isInHelper = false;

    FOREACH_INSTR_IN_FUNC_EDITING(instr, instrNext, this->func)
    {
        switch (instr->GetKind())
        {
        case IR::InstrKindLabel:
        case IR::InstrKindProfiledLabel:
        {
            if (!peepsEnabled)
            {
                break;
            }
            // Don't carry any regMap info across label
            this->ClearRegMap();

            // Remove unreferenced labels
            if (instr->AsLabelInstr()->IsUnreferenced())
            {
                bool peeped;
                instrNext = PeepUnreachableLabel(instr->AsLabelInstr(), isInHelper, &peeped);
                if(peeped)
                {
                    continue;
                }
            }
            else
            {
                // Try to peep a previous branch again after dead label blocks are removed. For instance:
                //         jmp L2
                //     L3:
                //         // dead code
                //     L2:
                // L3 is unreferenced, so after that block is removed, the branch-to-next can be removed. After that, if L2 is
                // unreferenced and only has fallthrough, it can be removed as well.
                IR::Instr *const prevInstr = instr->GetPrevRealInstr();
                if(prevInstr->IsBranchInstr())
                {
                    IR::BranchInstr *const branch = prevInstr->AsBranchInstr();
                    if(branch->IsUnconditional() && !branch->IsMultiBranch() && branch->GetTarget() == instr)
                    {
                        bool peeped;
                        IR::Instr *const branchNext = branch->m_next;
                        IR::Instr *const branchNextAfterPeep = PeepBranch(branch, &peeped);
                        if(peeped || branchNextAfterPeep != branchNext)
                        {
                            // The peep did something, restart from after the branch
                            instrNext = branchNextAfterPeep;
                            continue;
                        }
                    }
                }
            }

            isInHelper = instr->AsLabelInstr()->isOpHelper;

            if (instrNext->IsLabelInstr())
            {
                // CLean up double label
                instrNext = this->CleanupLabel(instr->AsLabelInstr(), instrNext->AsLabelInstr());
            }

#if defined(_M_IX86) || defined(_M_X64)
            Assert(instrNext->IsLabelInstr() || instrNext->m_prev->IsLabelInstr());
            IR::LabelInstr *const peepCondMoveLabel =
                instrNext->IsLabelInstr() ? instrNext->AsLabelInstr() : instrNext->m_prev->AsLabelInstr();
            instrNext = PeepCondMove(peepCondMoveLabel, instrNext, isInHelper && peepCondMoveLabel->isOpHelper);
#endif

            break;
        }

        case IR::InstrKindBranch:
        {
            if (!peepsEnabled || instr->m_opcode == Js::OpCode::Leave)
            {
                break;
            }

            IR::BranchInstr *branchInstr = instr->AsBranchInstr();
            IR::LabelInstr* target = branchInstr->GetTarget();

            // Don't remove any branches to the generator's epilogue
            if (target != nullptr && target->IsGeneratorEpilogueLabel())
            {
                break;
            }

            instrNext = Peeps::PeepBranch(branchInstr);
#if defined(_M_IX86) || defined(_M_X64)
            Assert(instrNext && instrNext->m_prev);
            if (instrNext->m_prev->IsBranchInstr())
            {
                instrNext = this->HoistSameInstructionAboveSplit(instrNext->m_prev->AsBranchInstr(), instrNext);
            }

#endif
            break;
        }
        case IR::InstrKindPragma:
            if (instr->m_opcode == Js::OpCode::Nop)
            {
                instr->Remove();
            }
            break;

        default:
            if (LowererMD::IsAssign(instr))
            {
                if (!peepsEnabled)
                {
                    break;
                }
                // Cleanup spill code
                instrNext = this->PeepAssign(instr);
            }
            else if (instr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn
                || instr->m_opcode == Js::OpCode::StartCall
                || instr->m_opcode == Js::OpCode::LoweredStartCall)
            {
                // ArgOut/StartCall are normally lowered by the lowering of the associated call instr.
                // If the call becomes unreachable, we could end up with an orphan ArgOut or StartCall.
                // Just delete these StartCalls
                instr->Remove();
            }
#if defined(_M_IX86) || defined(_M_X64)
            else if (instr->m_opcode == Js::OpCode::MOVSD_ZERO)
            {
                this->peepsMD.PeepAssign(instr);
                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
            }
            else if ( (instr->m_opcode == Js::OpCode::INC ) || (instr->m_opcode == Js::OpCode::DEC) )
            {
                // Check for any of the following patterns which can cause partial flag dependency
                //
                //                                                        Jcc or SHL or SHR or SAR or SHLD(in case of x64)
                // Jcc or SHL or SHR or SAR or SHLD(in case of x64)       Any Instruction
                // INC or DEC                                             INC or DEC
                // -------------------------------------------------- OR -----------------------
                // INC or DEC                                             INC or DEC
                // Jcc or SHL or SHR or SAR or SHLD(in case of x64)       Any Instruction
                //                                                        Jcc or SHL or SHR or SAR or SHLD(in case of x64)
                //
                // With this optimization if any of the above pattern found, substitute INC/DEC with ADD/SUB respectively.
                if (!peepsEnabled)
                {
                    break;
                }

                if (AutoSystemInfo::Data.IsAtomPlatform() || PHASE_FORCE(Js::AtomPhase, this->func))
                {
                    bool pattern_found=false;

                    if ( !(instr->IsEntryInstr()) )
                    {
                        IR::Instr *prevInstr = instr->GetPrevRealInstr();
                        if ( IsJccOrShiftInstr(prevInstr)  )
                        {
                            pattern_found = true;
                        }
                        else if ( !(prevInstr->IsEntryInstr()) && IsJccOrShiftInstr(prevInstr->GetPrevRealInstr()) )
                        {
                            pattern_found=true;
                        }
                    }

                    if ( !pattern_found && !(instr->IsExitInstr()) )
                    {
                        IR::Instr *nextInstr = instr->GetNextRealInstr();
                        if ( IsJccOrShiftInstr(nextInstr) )
                        {
                            pattern_found = true;
                        }
                        else if ( !(nextInstr->IsExitInstr() ) && (IsJccOrShiftInstr(nextInstr->GetNextRealInstr())) )
                        {
                            pattern_found = true;
                        }
                    }

                    if (pattern_found)
                    {
                        IR::IntConstOpnd* constOne  = IR::IntConstOpnd::New((IntConstType) 1, instr->GetDst()->GetType(), instr->m_func);
                        IR::Instr * addOrSubInstr = IR::Instr::New(Js::OpCode::ADD, instr->GetDst(), instr->GetDst(), constOne, instr->m_func);

                        if (instr->m_opcode == Js::OpCode::DEC)
                        {
                            addOrSubInstr->m_opcode = Js::OpCode::SUB;
                        }

                        instr->InsertAfter(addOrSubInstr);
                        instr->Remove();
                        instr = addOrSubInstr;
                    }
                }

                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
            }

#endif
            else
            {
                if (!peepsEnabled)
                {
                    break;
                }
#if defined(_M_IX86) || defined(_M_X64)
               instr = this->PeepRedundant(instr);
#endif

                IR::Opnd *dst = instr->GetDst();

                // Look for explicit reg kills
                if (dst && dst->IsRegOpnd())
                {
                    this->ClearReg(dst->AsRegOpnd()->GetReg());
                }
                // Kill callee-saved regs across calls and other implicit regs
                this->peepsMD.ProcessImplicitRegs(instr);

#if defined(_M_IX86) || defined(_M_X64)
                if (instr->m_opcode == Js::OpCode::TEST && instr->GetSrc2()->IsIntConstOpnd()
                    && ((instr->GetSrc2()->AsIntConstOpnd()->GetValue() & 0xFFFFFF00) == 0)
                    && instr->GetSrc1()->IsRegOpnd() && (LinearScan::GetRegAttribs(instr->GetSrc1()->AsRegOpnd()->GetReg()) & RA_BYTEABLE))
                {
                    // Only support if the branch is JEQ or JNE to ensure we don't look at the sign flag
                    if (instrNext->IsBranchInstr() &&
                        (instrNext->m_opcode == Js::OpCode::JNE || instrNext->m_opcode == Js::OpCode::JEQ))
                    {
                        instr->GetSrc1()->SetType(TyInt8);
                        instr->GetSrc2()->SetType(TyInt8);
                    }
                }

                if (instr->m_opcode == Js::OpCode::CVTSI2SD)
                {
                    IR::Instr *xorps = IR::Instr::New(Js::OpCode::XORPS, instr->GetDst(), instr->GetDst(), instr->GetDst(), instr->m_func);
                    instr->InsertBefore(xorps);
                }
#endif
            }
        }
    }